

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O2

_internalformats *
gl4cts::TextureViewUtilities::getInternalformatsFromViewClass
          (_internalformats *__return_storage_ptr__,_view_class view_class)

{
  uint n_array_pair;
  long lVar1;
  GLenum internalformat;
  value_type_conflict4 local_2c;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (lVar1 = 0; lVar1 != 0x3e; lVar1 = lVar1 + 1) {
    local_2c = (&internalformat_view_compatibility_array)[lVar1 * 2];
    if ((&DAT_016f2fd4)[lVar1 * 2] == view_class) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (__return_storage_ptr__,&local_2c);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

TextureViewUtilities::_internalformats TextureViewUtilities::getInternalformatsFromViewClass(_view_class view_class)
{
	_internalformats result;

	/* Iterate over the data array and push those internalformats that match the requested view class */
	const unsigned int n_array_elements = n_internalformat_view_compatibility_array_entries;

	for (unsigned int n_array_pair = 0; n_array_pair < (n_array_elements >> 1); ++n_array_pair)
	{
		const glw::GLenum internalformat = internalformat_view_compatibility_array[n_array_pair * 2 + 0];
		const _view_class current_view_class =
			(_view_class)internalformat_view_compatibility_array[n_array_pair * 2 + 1];

		if (current_view_class == view_class)
		{
			result.push_back(internalformat);
		}
	} /* for (all pairs in the data array) */

	return result;
}